

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  bool bVar1;
  byte bVar2;
  int iVar3;
  _Setw _Var4;
  _Setprecision _Var5;
  ostream *poVar6;
  char *pcVar7;
  iterator __first;
  iterator __last;
  uint *puVar8;
  double dVar9;
  double dVar10;
  int local_884;
  undefined1 local_880 [4];
  int j;
  string local_860;
  int local_840;
  int local_83c;
  int local_838;
  int local_834;
  int local_830;
  int local_82c;
  int local_828;
  int local_824;
  int local_820;
  int local_81c;
  int local_818;
  int local_814;
  int local_810;
  int local_80c;
  int local_808;
  int local_804;
  int local_800;
  int local_7fc;
  int local_7f8;
  int local_7f4;
  string local_7f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_790;
  long local_770;
  ofstream fout;
  char *dirname_cc;
  undefined1 local_560 [8];
  string dirname;
  char dirname_c [8];
  int i;
  poscar local_468;
  undefined1 local_3a0 [8];
  poscar delta;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  undefined1 local_298 [8];
  poscar pnn;
  string local_1c8;
  undefined1 local_1a8 [8];
  poscar p00;
  undefined1 local_d8 [8];
  string lastdirname;
  char lastdirname_c [8];
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_a0;
  uint local_98;
  allocator local_91;
  int maxdirnum;
  int local_70;
  int local_6c;
  dirent *local_68;
  dirent *entry;
  DIR *dp;
  undefined1 local_48 [8];
  regex re;
  vector<int,_std::allocator<int>_> dirnames;
  
  dirnames.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &re._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_48,"\\d+",0x10);
  entry = (dirent *)opendir("./");
  if (entry == (dirent *)0x0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"No Directory");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    dirnames.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = -1;
    local_6c = 1;
  }
  else {
    do {
      local_68 = readdir((DIR *)entry);
      if (((local_68 != (dirent *)0x0) && (local_68->d_type == '\x04')) &&
         (bVar1 = std::regex_match<char,std::__cxx11::regex_traits<char>>
                            (local_68->d_name,
                             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_48,0),
         bVar1)) {
        pcVar7 = local_68->d_name;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&maxdirnum,pcVar7,&local_91);
        local_70 = std::__cxx11::stoi((string *)&maxdirnum,(size_t *)0x0,10);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   &re._M_automaton.
                    super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,&local_70);
        std::__cxx11::string::~string((string *)&maxdirnum);
        std::allocator<char>::~allocator((allocator<char> *)&local_91);
      }
    } while (local_68 != (dirent *)0x0);
    this = &re._M_automaton.
            super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount;
    __first = std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)this);
    __last = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)this);
    local_a0 = std::
               max_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                         (__first._M_current,__last._M_current);
    puVar8 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&local_a0);
    local_98 = *puVar8;
    sprintf(lastdirname.field_2._M_local_buf + 8,"%02d",(ulong)local_98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_d8,lastdirname.field_2._M_local_buf + 8,
               (allocator *)
               ((long)&p00.coods.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&p00.coods.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_1c8,"00/POSCAR",
               (allocator *)
               ((long)&pnn.coods.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    poscar::poscar((poscar *)local_1a8,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&pnn.coods.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    bVar1 = poscar::isReady((poscar *)local_1a8);
    if (bVar1) {
      std::operator+(&local_2b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                     "/POSCAR");
      poscar::poscar((poscar *)local_298,&local_2b8);
      std::__cxx11::string::~string((string *)&local_2b8);
      bVar1 = poscar::isReady((poscar *)local_298);
      if (bVar1) {
        poscar::poscar(&local_468,(poscar *)local_1a8);
        poscar::poscar((poscar *)(dirname_c + 4),(poscar *)local_298);
        poscar::poscar((poscar *)local_3a0,&local_468,(poscar *)(dirname_c + 4),local_98);
        poscar::~poscar((poscar *)(dirname_c + 4));
        poscar::~poscar(&local_468);
        dirname_c[0] = '\x01';
        dirname_c[1] = '\0';
        dirname_c[2] = '\0';
        dirname_c[3] = '\0';
        for (; (int)dirname_c._0_4_ < (int)local_98; dirname_c._0_4_ = dirname_c._0_4_ + 1) {
          sprintf(dirname.field_2._M_local_buf + 0xc,"%02d",(ulong)(uint)dirname_c._0_4_);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)local_560,dirname.field_2._M_local_buf + 0xc,
                     (allocator *)((long)&dirname_cc + 7));
          std::allocator<char>::~allocator((allocator<char> *)((long)&dirname_cc + 7));
          mkdir(dirname.field_2._M_local_buf + 0xc,0x1ed);
          std::operator+(&local_790,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_560,"/POSCAR");
          std::ofstream::ofstream(&local_770,&local_790,0x10);
          std::__cxx11::string::~string((string *)&local_790);
          bVar2 = std::ios::operator!((ios *)((long)&local_770 + *(long *)(local_770 + -0x18)));
          if ((bVar2 & 1) == 0) {
            poscar::getTitle_abi_cxx11_(&local_7f0,(poscar *)local_3a0);
            poVar6 = std::operator<<((ostream *)&local_770,(string *)&local_7f0);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string((string *)&local_7f0);
            poVar6 = std::operator<<((ostream *)&local_770,"   ");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::fixed);
            local_7f4 = (int)std::setw(0x12);
            poVar6 = std::operator<<(poVar6,(_Setw)local_7f4);
            local_7f8 = (int)std::setprecision(0x10);
            poVar6 = std::operator<<(poVar6,(_Setprecision)local_7f8);
            dVar9 = poscar::getScale((poscar *)local_1a8);
            dVar10 = poscar::getScale((poscar *)local_3a0);
            poVar6 = (ostream *)
                     std::ostream::operator<<(poVar6,dVar10 * (double)(int)dirname_c._0_4_ + dVar9);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            poVar6 = std::operator<<((ostream *)&local_770,"    ");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::fixed);
            local_7fc = (int)std::setw(0x13);
            poVar6 = std::operator<<(poVar6,(_Setw)local_7fc);
            local_800 = (int)std::setprecision(0x10);
            poVar6 = std::operator<<(poVar6,(_Setprecision)local_800);
            dVar9 = poscar::getLattice((poscar *)local_1a8,0);
            dVar10 = poscar::getLattice((poscar *)local_3a0,0);
            poVar6 = (ostream *)
                     std::ostream::operator<<(poVar6,dVar10 * (double)(int)dirname_c._0_4_ + dVar9);
            poVar6 = std::operator<<(poVar6,"   ");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::fixed);
            local_804 = (int)std::setw(0x13);
            poVar6 = std::operator<<(poVar6,(_Setw)local_804);
            local_808 = (int)std::setprecision(0x10);
            poVar6 = std::operator<<(poVar6,(_Setprecision)local_808);
            dVar9 = poscar::getLattice((poscar *)local_1a8,1);
            dVar10 = poscar::getLattice((poscar *)local_3a0,1);
            poVar6 = (ostream *)
                     std::ostream::operator<<(poVar6,dVar10 * (double)(int)dirname_c._0_4_ + dVar9);
            poVar6 = std::operator<<(poVar6,"   ");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::fixed);
            local_80c = (int)std::setw(0x13);
            poVar6 = std::operator<<(poVar6,(_Setw)local_80c);
            local_810 = (int)std::setprecision(0x10);
            poVar6 = std::operator<<(poVar6,(_Setprecision)local_810);
            dVar9 = poscar::getLattice((poscar *)local_1a8,2);
            dVar10 = poscar::getLattice((poscar *)local_3a0,2);
            poVar6 = (ostream *)
                     std::ostream::operator<<(poVar6,dVar10 * (double)(int)dirname_c._0_4_ + dVar9);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            poVar6 = std::operator<<((ostream *)&local_770,"    ");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::fixed);
            local_814 = (int)std::setw(0x13);
            poVar6 = std::operator<<(poVar6,(_Setw)local_814);
            local_818 = (int)std::setprecision(0x10);
            poVar6 = std::operator<<(poVar6,(_Setprecision)local_818);
            dVar9 = poscar::getLattice((poscar *)local_1a8,3);
            dVar10 = poscar::getLattice((poscar *)local_3a0,3);
            poVar6 = (ostream *)
                     std::ostream::operator<<(poVar6,dVar10 * (double)(int)dirname_c._0_4_ + dVar9);
            poVar6 = std::operator<<(poVar6,"   ");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::fixed);
            local_81c = (int)std::setw(0x13);
            poVar6 = std::operator<<(poVar6,(_Setw)local_81c);
            local_820 = (int)std::setprecision(0x10);
            poVar6 = std::operator<<(poVar6,(_Setprecision)local_820);
            dVar9 = poscar::getLattice((poscar *)local_1a8,4);
            dVar10 = poscar::getLattice((poscar *)local_3a0,4);
            poVar6 = (ostream *)
                     std::ostream::operator<<(poVar6,dVar10 * (double)(int)dirname_c._0_4_ + dVar9);
            poVar6 = std::operator<<(poVar6,"   ");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::fixed);
            local_824 = (int)std::setw(0x13);
            poVar6 = std::operator<<(poVar6,(_Setw)local_824);
            local_828 = (int)std::setprecision(0x10);
            poVar6 = std::operator<<(poVar6,(_Setprecision)local_828);
            dVar9 = poscar::getLattice((poscar *)local_1a8,5);
            dVar10 = poscar::getLattice((poscar *)local_3a0,5);
            poVar6 = (ostream *)
                     std::ostream::operator<<(poVar6,dVar10 * (double)(int)dirname_c._0_4_ + dVar9);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            poVar6 = std::operator<<((ostream *)&local_770,"    ");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::fixed);
            local_82c = (int)std::setw(0x13);
            poVar6 = std::operator<<(poVar6,(_Setw)local_82c);
            local_830 = (int)std::setprecision(0x10);
            poVar6 = std::operator<<(poVar6,(_Setprecision)local_830);
            dVar9 = poscar::getLattice((poscar *)local_1a8,6);
            dVar10 = poscar::getLattice((poscar *)local_3a0,6);
            poVar6 = (ostream *)
                     std::ostream::operator<<(poVar6,dVar10 * (double)(int)dirname_c._0_4_ + dVar9);
            poVar6 = std::operator<<(poVar6,"   ");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::fixed);
            local_834 = (int)std::setw(0x13);
            poVar6 = std::operator<<(poVar6,(_Setw)local_834);
            local_838 = (int)std::setprecision(0x10);
            poVar6 = std::operator<<(poVar6,(_Setprecision)local_838);
            dVar9 = poscar::getLattice((poscar *)local_1a8,7);
            dVar10 = poscar::getLattice((poscar *)local_3a0,7);
            poVar6 = (ostream *)
                     std::ostream::operator<<(poVar6,dVar10 * (double)(int)dirname_c._0_4_ + dVar9);
            poVar6 = std::operator<<(poVar6,"   ");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::fixed);
            local_83c = (int)std::setw(0x13);
            poVar6 = std::operator<<(poVar6,(_Setw)local_83c);
            local_840 = (int)std::setprecision(0x10);
            poVar6 = std::operator<<(poVar6,(_Setprecision)local_840);
            dVar9 = poscar::getLattice((poscar *)local_1a8,8);
            dVar10 = poscar::getLattice((poscar *)local_3a0,8);
            poVar6 = (ostream *)
                     std::ostream::operator<<(poVar6,dVar10 * (double)(int)dirname_c._0_4_ + dVar9);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            poVar6 = std::operator<<((ostream *)&local_770,"   ");
            poscar::getElementsAsString_abi_cxx11_(&local_860,(poscar *)local_3a0);
            poVar6 = std::operator<<(poVar6,(string *)&local_860);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string((string *)&local_860);
            poVar6 = std::operator<<((ostream *)&local_770,"   ");
            poscar::getAtomNumsAsString_abi_cxx11_((string *)local_880,(poscar *)local_3a0);
            poVar6 = std::operator<<(poVar6,(string *)local_880);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string((string *)local_880);
            poVar6 = std::operator<<((ostream *)&local_770,"Direct");
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            for (local_884 = 0; iVar3 = poscar::getAtomNum((poscar *)local_3a0), local_884 < iVar3;
                local_884 = local_884 + 1) {
              poVar6 = std::operator<<((ostream *)&local_770," ");
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::fixed);
              _Var4 = std::setw(0x13);
              poVar6 = std::operator<<(poVar6,_Var4);
              _Var5 = std::setprecision(0x10);
              poVar6 = std::operator<<(poVar6,_Var5);
              dVar9 = poscar::getCood((poscar *)local_1a8,local_884 * 3);
              dVar10 = poscar::getCood((poscar *)local_3a0,local_884 * 3);
              poVar6 = (ostream *)
                       std::ostream::operator<<
                                 (poVar6,dVar10 * (double)(int)dirname_c._0_4_ + dVar9);
              poVar6 = std::operator<<(poVar6," ");
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::fixed);
              _Var4 = std::setw(0x13);
              poVar6 = std::operator<<(poVar6,_Var4);
              _Var5 = std::setprecision(0x10);
              poVar6 = std::operator<<(poVar6,_Var5);
              dVar9 = poscar::getCood((poscar *)local_1a8,local_884 * 3 + 1);
              dVar10 = poscar::getCood((poscar *)local_3a0,local_884 * 3 + 1);
              poVar6 = (ostream *)
                       std::ostream::operator<<
                                 (poVar6,dVar10 * (double)(int)dirname_c._0_4_ + dVar9);
              poVar6 = std::operator<<(poVar6," ");
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::fixed);
              _Var4 = std::setw(0x13);
              poVar6 = std::operator<<(poVar6,_Var4);
              _Var5 = std::setprecision(0x10);
              poVar6 = std::operator<<(poVar6,_Var5);
              dVar9 = poscar::getCood((poscar *)local_1a8,local_884 * 3 + 2);
              dVar10 = poscar::getCood((poscar *)local_3a0,local_884 * 3 + 2);
              poVar6 = (ostream *)
                       std::ostream::operator<<
                                 (poVar6,dVar10 * (double)(int)dirname_c._0_4_ + dVar9);
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            }
            local_6c = 0;
          }
          else {
            std::operator+(&local_7d0,"Error during making ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_560);
            std::operator+(&local_7b0,&local_7d0,"/POSCAR!");
            poVar6 = std::operator<<((ostream *)&std::cout,(string *)&local_7b0);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string((string *)&local_7b0);
            std::__cxx11::string::~string((string *)&local_7d0);
            dirnames.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._4_4_ = -1;
            local_6c = 1;
          }
          std::ofstream::~ofstream(&local_770);
          std::__cxx11::string::~string((string *)local_560);
          if (local_6c != 0) goto LAB_00107223;
        }
        dirnames.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = 0;
        local_6c = 1;
LAB_00107223:
        poscar::~poscar((poscar *)local_3a0);
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &delta.coods.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8
                       ,"/POSCAR was not read.");
        poVar6 = std::operator<<((ostream *)&std::cout,
                                 (string *)
                                 &delta.coods.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string
                  ((string *)
                   &delta.coods.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        dirnames.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = -1;
        local_6c = 1;
      }
      poscar::~poscar((poscar *)local_298);
    }
    else {
      poVar6 = std::operator<<((ostream *)&std::cout,"00/POSCAR was not read.");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      dirnames.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = -1;
      local_6c = 1;
    }
    poscar::~poscar((poscar *)local_1a8);
    std::__cxx11::string::~string((string *)local_d8);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_48);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &re._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return dirnames.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_;
}

Assistant:

int main() {

    // ディレクトリ取得
    vector<int> dirnames;
    regex re("\\d+");
    DIR *dp;        // pointer for directory
    dirent *entry;  // entry point returned by readdir()

    dp = opendir("./");
    if (dp == NULL) {
        cout << "No Directory" << endl;
        return -1;
    }
    do {
        entry = readdir(dp);
        if (entry != NULL) {
            if (entry->d_type == DT_DIR) {
                if (regex_match(entry->d_name, re)) {
                    dirnames.push_back(stoi(entry->d_name));
                }
            }
        }
    } while (entry != NULL);

    int maxdirnum = *max_element(dirnames.begin(), dirnames.end());
    char lastdirname_c[8];
    sprintf(lastdirname_c, "%02d", maxdirnum);
    string lastdirname = string(lastdirname_c);

    // read POSCAR
    poscar p00("00/POSCAR");
    if (!p00.isReady()) {
        cout << "00/POSCAR was not read." << endl;
        return -1;
    }
    poscar pnn(lastdirname + "/POSCAR");
    if (!pnn.isReady()) {
        cout << lastdirname + "/POSCAR was not read." << endl;
        return -1;
    }

    // delta POSCAR
    poscar delta(p00, pnn, maxdirnum);

    // make directory
    for (int i = 1; i < maxdirnum; i++) {
        char dirname_c[8];
        sprintf(dirname_c, "%02d", i);
        string dirname = string(dirname_c);
        const char *dirname_cc = dirname_c;
        mkdir(dirname_cc, 0755);

        // make poscar
        ofstream fout(dirname + "/POSCAR");
        if (!fout) {
            cout << "Error during making " + dirname + "/POSCAR!" << endl;
            return -1;
        }

        fout << delta.getTitle() << endl;
        fout << "   "  << fixed << setw(18) << setprecision(16) << p00.getScale() + delta.getScale() * i << endl;
        fout << "    " << fixed << setw(19) << setprecision(16) << p00.getLattice(0) + delta.getLattice(0) * i
             << "   "  << fixed << setw(19) << setprecision(16) << p00.getLattice(1) + delta.getLattice(1) * i
             << "   "  << fixed << setw(19) << setprecision(16) << p00.getLattice(2) + delta.getLattice(2) * i << endl;
        fout << "    " << fixed << setw(19) << setprecision(16) << p00.getLattice(3) + delta.getLattice(3) * i
             << "   "  << fixed << setw(19) << setprecision(16) << p00.getLattice(4) + delta.getLattice(4) * i
             << "   "  << fixed << setw(19) << setprecision(16) << p00.getLattice(5) + delta.getLattice(5) * i << endl;
        fout << "    " << fixed << setw(19) << setprecision(16) << p00.getLattice(6) + delta.getLattice(6) * i
             << "   "  << fixed << setw(19) << setprecision(16) << p00.getLattice(7) + delta.getLattice(7) * i
             << "   "  << fixed << setw(19) << setprecision(16) << p00.getLattice(8) + delta.getLattice(8) * i << endl;
        fout << "   "  << delta.getElementsAsString() << endl;
        fout << "   "  << delta.getAtomNumsAsString() << endl;
        fout << "Direct" << endl;
        for (int j = 0; j < delta.getAtomNum(); j++) {
            fout << " " << fixed << setw(19) << setprecision(16) << p00.getCood(0 + 3*j) + delta.getCood(0 + 3*j) * i
                 << " " << fixed << setw(19) << setprecision(16) << p00.getCood(1 + 3*j) + delta.getCood(1 + 3*j) * i
                 << " " << fixed << setw(19) << setprecision(16) << p00.getCood(2 + 3*j) + delta.getCood(2 + 3*j) * i << endl;
        }

    }

    return 0;
}